

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListTags
               (ostream *out,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
               bool isFiltered)

{
  bool bVar1;
  ReusableStringStream *this;
  Column *pCVar2;
  size_t newIndent;
  char *rawChars;
  ostream *poVar3;
  byte in_DL;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *in_RSI;
  pluralise *in_RDI;
  StringRef label;
  Column wrapper;
  string str;
  ReusableStringStream rss;
  TagInfo *tagCount;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *__range1;
  Column *in_stack_fffffffffffffe58;
  Column *in_stack_fffffffffffffe60;
  _Setw *in_stack_fffffffffffffe68;
  ReusableStringStream *in_stack_fffffffffffffe70;
  pluralise local_130;
  TagInfo *in_stack_fffffffffffffee8;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  string local_78 [32];
  int local_58;
  reference local_38;
  TagInfo *local_30;
  __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
  local_28;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *local_20;
  byte local_11;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *local_10;
  pluralise *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_11 == 0) {
    std::operator<<((ostream *)in_RDI,"All available tags:\n");
  }
  else {
    std::operator<<((ostream *)in_RDI,"Tags for matching test cases:\n");
  }
  local_20 = local_10;
  local_28._M_current =
       (TagInfo *)
       std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::begin
                 ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)
                  in_stack_fffffffffffffe58);
  local_30 = (TagInfo *)
             std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::end
                       ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)
                        in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
               ::operator*(&local_28);
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffe60);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffe60,
               (char (*) [3])in_stack_fffffffffffffe58);
    local_58 = (int)std::setw(2);
    this = ReusableStringStream::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffe60,
               (unsigned_long *)in_stack_fffffffffffffe58);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffe60,
               (char (*) [3])in_stack_fffffffffffffe58);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffe58);
    TagInfo::all_abi_cxx11_(in_stack_fffffffffffffee8);
    TextFlow::Column::Column(in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
    pCVar2 = TextFlow::Column::initialIndent((Column *)&stack0xffffffffffffff08,0);
    newIndent = std::__cxx11::string::size();
    pCVar2 = TextFlow::Column::indent(pCVar2,newIndent);
    TextFlow::Column::width(pCVar2,0x46);
    TextFlow::Column::Column(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    TextFlow::Column::~Column((Column *)0x19c7f4);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    std::operator<<((ostream *)local_8,local_78);
    in_stack_fffffffffffffe70 =
         (ReusableStringStream *)
         TextFlow::operator<<
                   ((ostream *)in_stack_ffffffffffffff20,(Column *)in_stack_ffffffffffffff18);
    std::operator<<((ostream *)in_stack_fffffffffffffe70,'\n');
    TextFlow::Column::~Column((Column *)0x19c854);
    std::__cxx11::string::~string(local_78);
    ReusableStringStream::~ReusableStringStream(this);
    __gnu_cxx::
    __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
    ::operator++(&local_28);
  }
  rawChars = (char *)std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::size(local_10);
  label = operator____sr(rawChars,(size_t)in_stack_fffffffffffffe58);
  pluralise::pluralise(&local_130,(uint64_t)rawChars,label);
  poVar3 = operator<<((ostream *)in_stack_fffffffffffffe70,local_8);
  poVar3 = std::operator<<(poVar3,"\n\n");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void defaultListTags( std::ostream& out,
                          std::vector<TagInfo> const& tags,
                          bool isFiltered ) {
        if ( isFiltered ) {
            out << "Tags for matching test cases:\n";
        } else {
            out << "All available tags:\n";
        }

        for ( auto const& tagCount : tags ) {
            ReusableStringStream rss;
            rss << "  " << std::setw( 2 ) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column( tagCount.all() )
                               .initialIndent( 0 )
                               .indent( str.size() )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - 10 );
            out << str << wrapper << '\n';
        }
        out << pluralise(tags.size(), "tag"_sr) << "\n\n" << std::flush;
    }